

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_extension.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::ImmutableExtensionGenerator::ImmutableExtensionGenerator
          (ImmutableExtensionGenerator *this,FieldDescriptor *descriptor,Context *context)

{
  Descriptor *descriptor_00;
  ClassNameResolver *this_00;
  string local_30;
  
  (this->super_ExtensionGenerator)._vptr_ExtensionGenerator =
       (_func_int **)&PTR__ImmutableExtensionGenerator_00427148;
  this->descriptor_ = descriptor;
  this->context_ = context;
  this_00 = Context::GetNameResolver(context);
  this->name_resolver_ = this_00;
  (this->scope_)._M_dataplus._M_p = (pointer)&(this->scope_).field_2;
  (this->scope_)._M_string_length = 0;
  (this->scope_).field_2._M_local_buf[0] = '\0';
  descriptor_00 = *(Descriptor **)(this->descriptor_ + 0x68);
  if (descriptor_00 == (Descriptor *)0x0) {
    ClassNameResolver::GetImmutableClassName<google::protobuf::FileDescriptor>
              (&local_30,this_00,*(FileDescriptor **)(this->descriptor_ + 0x30));
  }
  else {
    ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
              (&local_30,this_00,descriptor_00);
  }
  std::__cxx11::string::operator=((string *)&this->scope_,(string *)&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

ImmutableExtensionGenerator::ImmutableExtensionGenerator(
    const FieldDescriptor* descriptor, Context* context)
  : descriptor_(descriptor), context_(context),
    name_resolver_(context->GetNameResolver()) {
  if (descriptor_->extension_scope() != NULL) {
    scope_ = name_resolver_->GetImmutableClassName(
        descriptor_->extension_scope());
  } else {
    scope_ = name_resolver_->GetImmutableClassName(descriptor_->file());
  }
}